

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

string * __thiscall
dap::BasicTypeInfo<std::vector<dap::any,std::allocator<dap::any>>>::name_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  BasicTypeInfo<std::vector<dap::any,_std::allocator<dap::any>_>_> *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)((long)this + 8));
  return __return_storage_ptr__;
}

Assistant:

inline std::string name() const override { return name_; }